

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

SinhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_sinh(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x2ee) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x2ee;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    SinhLayerParams::SinhLayerParams(this_00.sinh_);
    (this->layer_).sinh_ = (SinhLayerParams *)this_00;
  }
  return (SinhLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SinhLayerParams* NeuralNetworkLayer::mutable_sinh() {
  if (!has_sinh()) {
    clear_layer();
    set_has_sinh();
    layer_.sinh_ = new ::CoreML::Specification::SinhLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sinh)
  return layer_.sinh_;
}